

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionElimination.cc
# Opt level: O3

bool flow::transform::rewriteCondBrToSameBranches(IRHandler *handler)

{
  _List_node_base *p_Var1;
  BasicBlock *this;
  pointer ppVVar2;
  BasicBlock *targetBlock;
  byte in_AL;
  TerminateInstr *pTVar3;
  tuple<flow::Instr_*,_std::default_delete<flow::Instr>_> this_00;
  byte bVar4;
  pointer *__ptr;
  __uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_> local_38;
  _func_int **local_30;
  
  p_Var1 = (handler->blocks_).
           super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var1 == (_List_node_base *)&handler->blocks_) {
      bVar4 = 0;
LAB_0014f904:
      return (bool)(bVar4 & in_AL);
    }
    this = (BasicBlock *)p_Var1[1]._M_next;
    pTVar3 = BasicBlock::getTerminator(this);
    if ((pTVar3 != (TerminateInstr *)0x0) &&
       (pTVar3 = (TerminateInstr *)
                 __dynamic_cast(pTVar3,&TerminateInstr::typeinfo,&CondBrInstr::typeinfo,0),
       pTVar3 != (TerminateInstr *)0x0)) {
      ppVVar2 = (pTVar3->super_Instr).operands_.
                super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      targetBlock = (BasicBlock *)ppVVar2[1];
      if (targetBlock == (BasicBlock *)ppVVar2[2]) {
        BasicBlock::remove((BasicBlock *)&stack0xffffffffffffffd0,(char *)this);
        if (local_30 != (_func_int **)0x0) {
          (**(code **)(*local_30 + 8))();
        }
        local_30 = (_func_int **)0x0;
        this_00.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl =
             (_Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>)operator_new(0x68);
        BrInstr::BrInstr((BrInstr *)
                         this_00.
                         super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
                         super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl,targetBlock);
        local_38._M_t.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
        super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl =
             (tuple<flow::Instr_*,_std::default_delete<flow::Instr>_>)
             (tuple<flow::Instr_*,_std::default_delete<flow::Instr>_>)
             this_00.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
             super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
        BasicBlock::push_back
                  (this,(unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> *)&local_38);
        bVar4 = 1;
        if ((_Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>)
            local_38._M_t.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
            super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl != (Instr *)0x0) {
          (**(code **)(*(long *)local_38._M_t.
                                super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>
                                .super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl + 8))();
        }
        in_AL = 1;
      }
      else {
        bVar4 = 1;
        in_AL = 0;
      }
      goto LAB_0014f904;
    }
    in_AL = (byte)pTVar3;
    p_Var1 = p_Var1->_M_next;
  } while( true );
}

Assistant:

bool rewriteCondBrToSameBranches(IRHandler* handler) {
  for (BasicBlock* bb : handler->basicBlocks()) {
    // attempt to eliminate useless condbr
    if (CondBrInstr* condbr = dynamic_cast<CondBrInstr*>(bb->getTerminator())) {
      if (condbr->trueBlock() != condbr->falseBlock())
        return false;

      BasicBlock* nextBB = condbr->trueBlock();

      // remove old terminator
      bb->remove(condbr);

      // create new terminator
      bb->push_back(std::make_unique<BrInstr>(nextBB));

      //FLOW_TRACE("flow: rewrote condbr with true-block == false-block");
      return true;
    }
  }

  return false;
}